

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O3

void nhr_mutex_delete(nhr_mutex mutex)

{
  if (mutex != (nhr_mutex)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)mutex);
    nhr_free(mutex);
    return;
  }
  return;
}

Assistant:

void nhr_mutex_delete(nhr_mutex mutex) {
	if (mutex) {
#if defined(NHR_OS_WINDOWS)
		DeleteCriticalSection((LPCRITICAL_SECTION)mutex);
#else
		pthread_mutex_destroy((pthread_mutex_t *)mutex);
#endif
		nhr_free(mutex);
	}
}